

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::ParseHash(Parser *this,Value *e,FieldDef *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  short t;
  unsigned_short t_00;
  uint t_01;
  int iVar2;
  const_iterator cVar3;
  long lVar4;
  unsigned_long t_02;
  long in_RCX;
  code *pcVar5;
  key_type local_50;
  
  if (in_RCX != 0) {
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"hash","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)(in_RCX + 0x58),&local_50);
    if (cVar3._M_node == (_Base_ptr)(in_RCX + 0x60)) {
      lVar4 = 0;
    }
    else {
      lVar4 = *(long *)(cVar3._M_node + 2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    switch(*(undefined4 *)&(field->super_Definition).name._M_dataplus._M_p) {
    case 5:
      iVar2 = strcmp(*(char **)(lVar4 + 0x20),"fnv1_16");
      pcVar5 = HashFnv1a<unsigned_short>;
      if (iVar2 == 0) {
        pcVar5 = HashFnv1<unsigned_short>;
      }
      t = (*pcVar5)((e->constant)._M_string_length);
      NumToString<short>(&local_50,t);
      break;
    case 6:
      iVar2 = strcmp(*(char **)(lVar4 + 0x20),"fnv1_16");
      pcVar5 = HashFnv1a<unsigned_short>;
      if (iVar2 == 0) {
        pcVar5 = HashFnv1<unsigned_short>;
      }
      t_00 = (*pcVar5)((e->constant)._M_string_length);
      NumToString<unsigned_short>(&local_50,t_00);
      break;
    case 7:
      iVar2 = strcmp(*(char **)(lVar4 + 0x20),"fnv1_32");
      pcVar5 = HashFnv1a<unsigned_int>;
      if (iVar2 == 0) {
        pcVar5 = HashFnv1<unsigned_int>;
      }
      iVar2 = (*pcVar5)((e->constant)._M_string_length);
      NumToString<int>(&local_50,iVar2);
      break;
    case 8:
      iVar2 = strcmp(*(char **)(lVar4 + 0x20),"fnv1_32");
      pcVar5 = HashFnv1a<unsigned_int>;
      if (iVar2 == 0) {
        pcVar5 = HashFnv1<unsigned_int>;
      }
      t_01 = (*pcVar5)((e->constant)._M_string_length);
      NumToString<unsigned_int>(&local_50,t_01);
      break;
    case 9:
      iVar2 = strcmp(*(char **)(lVar4 + 0x20),"fnv1_64");
      pcVar5 = HashFnv1a<unsigned_long>;
      if (iVar2 == 0) {
        pcVar5 = HashFnv1<unsigned_long>;
      }
      lVar4 = (*pcVar5)((e->constant)._M_string_length);
      NumToString<long>(&local_50,lVar4);
      break;
    case 10:
      iVar2 = strcmp(*(char **)(lVar4 + 0x20),"fnv1_64");
      pcVar5 = HashFnv1a<unsigned_long>;
      if (iVar2 == 0) {
        pcVar5 = HashFnv1<unsigned_long>;
      }
      t_02 = (*pcVar5)((e->constant)._M_string_length);
      NumToString<unsigned_long>(&local_50,t_02);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                    ,0x7dd,"CheckedError flatbuffers::Parser::ParseHash(Value &, FieldDef *)");
    }
    std::__cxx11::string::operator=((string *)&(field->super_Definition).file,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    }
    return SUB82(this,0);
  }
  __assert_fail("field",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                ,0x7b6,"CheckedError flatbuffers::Parser::ParseHash(Value &, FieldDef *)");
}

Assistant:

CheckedError Parser::ParseHash(Value &e, FieldDef *field) {
  FLATBUFFERS_ASSERT(field);
  Value *hash_name = field->attributes.Lookup("hash");
  switch (e.type.base_type) {
    case BASE_TYPE_SHORT: {
      auto hash = FindHashFunction16(hash_name->constant.c_str());
      int16_t hashed_value = static_cast<int16_t>(hash(attribute_.c_str()));
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_USHORT: {
      auto hash = FindHashFunction16(hash_name->constant.c_str());
      uint16_t hashed_value = hash(attribute_.c_str());
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_INT: {
      auto hash = FindHashFunction32(hash_name->constant.c_str());
      int32_t hashed_value = static_cast<int32_t>(hash(attribute_.c_str()));
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_UINT: {
      auto hash = FindHashFunction32(hash_name->constant.c_str());
      uint32_t hashed_value = hash(attribute_.c_str());
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_LONG: {
      auto hash = FindHashFunction64(hash_name->constant.c_str());
      int64_t hashed_value = static_cast<int64_t>(hash(attribute_.c_str()));
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_ULONG: {
      auto hash = FindHashFunction64(hash_name->constant.c_str());
      uint64_t hashed_value = hash(attribute_.c_str());
      e.constant = NumToString(hashed_value);
      break;
    }
    default: FLATBUFFERS_ASSERT(0);
  }
  NEXT();
  return NoError();
}